

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O2

int __thiscall
soplex::SPxDefaultRT<double>::selectLeave
          (SPxDefaultRT<double> *this,double *val,double param_2,bool param_3)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  double *pdVar8;
  undefined7 in_register_00000011;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uint local_94;
  
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])
                    (this,val,CONCAT71(in_register_00000011,param_3));
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var,iVar7) + 0x6a8) + 0x20));
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar2 = **(long **)(CONCAT44(extraout_var_00,iVar7) + 0x6a8);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar3 = *(long *)(*(long *)(CONCAT44(extraout_var_01,iVar7) + 0x6a8) + 0x40);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar4 = *(long *)(CONCAT44(extraout_var_02,iVar7) + 0x6a8);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar5 = *(long *)(CONCAT44(extraout_var_03,iVar7) + 0x670);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar10 = *(long *)(CONCAT44(extraout_var_04,iVar7) + 0x688);
  iVar7 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  dVar13 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)CONCAT44(extraout_var_05,iVar7));
  dVar16 = -dVar13;
  local_94 = 0xffffffff;
  if (*val <= 0.0) {
    for (lVar12 = 0; lVar12 < *(int *)(lVar4 + 0x28); lVar12 = lVar12 + 1) {
      uVar1 = *(uint *)(*(long *)(lVar4 + 0x30) + lVar12 * 4);
      lVar11 = (long)(int)uVar1;
      dVar15 = *(double *)(lVar3 + lVar11 * 8);
      if (dVar16 <= dVar15) {
        if ((dVar13 < dVar15) &&
           (dVar14 = *(double *)(lVar10 + lVar11 * 8), pdVar8 = (double *)infinity(),
           -*pdVar8 < dVar14)) {
          dVar14 = (*(double *)(lVar10 + lVar11 * 8) - *(double *)(lVar2 + lVar11 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
          goto LAB_00202a97;
        }
      }
      else {
        dVar14 = *(double *)(lVar5 + lVar11 * 8);
        pdVar8 = (double *)infinity();
        if (dVar14 < *pdVar8) {
          dVar14 = (*(double *)(lVar5 + lVar11 * 8) - *(double *)(lVar2 + lVar11 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
LAB_00202a97:
          dVar14 = dVar14 / dVar15;
          if (*val <= dVar14 && dVar14 != *val) {
            *val = dVar14;
            local_94 = uVar1;
          }
        }
      }
    }
    if ((int)local_94 < 0) {
      return local_94;
    }
    uVar9 = (ulong)local_94;
    dVar15 = *(double *)(lVar3 + uVar9 * 8);
    if ((dVar16 <= dVar15) || (*(double *)(lVar2 + uVar9 * 8) < *(double *)(lVar5 + uVar9 * 8))) {
      if ((dVar13 < dVar15) &&
         (dVar16 = 0.0, *(double *)(lVar2 + uVar9 * 8) <= *(double *)(lVar10 + uVar9 * 8)))
      goto LAB_00202b5e;
      bVar6 = dVar15 < dVar13;
      goto LAB_00202b3f;
    }
  }
  else {
    for (lVar12 = 0; lVar12 < *(int *)(lVar4 + 0x28); lVar12 = lVar12 + 1) {
      uVar1 = *(uint *)(*(long *)(lVar4 + 0x30) + lVar12 * 4);
      lVar11 = (long)(int)uVar1;
      dVar15 = *(double *)(lVar3 + lVar11 * 8);
      if (dVar15 <= dVar13) {
        if ((dVar15 < dVar16) &&
           (dVar14 = *(double *)(lVar10 + lVar11 * 8), pdVar8 = (double *)infinity(),
           -*pdVar8 < dVar14)) {
          dVar14 = (*(double *)(lVar10 + lVar11 * 8) - *(double *)(lVar2 + lVar11 * 8)) -
                   (this->super_SPxRatioTester<double>).delta;
          goto LAB_00202920;
        }
      }
      else {
        dVar14 = *(double *)(lVar5 + lVar11 * 8);
        pdVar8 = (double *)infinity();
        if (dVar14 < *pdVar8) {
          dVar14 = (*(double *)(lVar5 + lVar11 * 8) - *(double *)(lVar2 + lVar11 * 8)) +
                   (this->super_SPxRatioTester<double>).delta;
LAB_00202920:
          if (dVar14 / dVar15 < *val) {
            *val = dVar14 / dVar15;
            local_94 = uVar1;
          }
        }
      }
    }
    if ((int)local_94 < 0) {
      return local_94;
    }
    uVar9 = (ulong)local_94;
    dVar15 = *(double *)(lVar3 + uVar9 * 8);
    bVar6 = dVar13 < dVar15;
    if ((dVar15 <= dVar13) || (*(double *)(lVar2 + uVar9 * 8) < *(double *)(lVar5 + uVar9 * 8))) {
      if ((dVar15 < dVar16) &&
         (dVar16 = 0.0, *(double *)(lVar2 + uVar9 * 8) <= *(double *)(lVar10 + uVar9 * 8)))
      goto LAB_00202b5e;
LAB_00202b3f:
      if (bVar6) {
        lVar10 = lVar5;
      }
      dVar13 = *(double *)(lVar10 + uVar9 * 8);
      *val = dVar13;
      dVar16 = (dVar13 - *(double *)(lVar2 + uVar9 * 8)) / dVar15;
      goto LAB_00202b5e;
    }
  }
  dVar16 = 0.0;
LAB_00202b5e:
  *val = dVar16;
  return local_94;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}